

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

void initialise_wcurve(ec_curve *curve,mp_int *p,mp_int *a,mp_int *b,mp_int *nonsquare,mp_int *G_x,
                      mp_int *G_y,mp_int *G_order)

{
  WeierstrassCurve *pWVar1;
  WeierstrassPoint *pWVar2;
  mp_int *pmVar3;
  mp_int *G_x_local;
  mp_int *nonsquare_local;
  mp_int *b_local;
  mp_int *a_local;
  mp_int *p_local;
  ec_curve *curve_local;
  
  initialise_common(curve,EC_WEIERSTRASS,p,0);
  pWVar1 = ecc_weierstrass_curve(p,a,b,nonsquare);
  (curve->field_6).w.wc = pWVar1;
  pWVar2 = ecc_weierstrass_point_new((curve->field_6).w.wc,G_x,G_y);
  (curve->field_6).w.G = pWVar2;
  pmVar3 = mp_copy(G_order);
  (curve->field_6).w.G_order = pmVar3;
  return;
}

Assistant:

static void initialise_wcurve(
    struct ec_curve *curve, mp_int *p, mp_int *a, mp_int *b,
    mp_int *nonsquare, mp_int *G_x, mp_int *G_y, mp_int *G_order)
{
    initialise_common(curve, EC_WEIERSTRASS, p, 0);

    curve->w.wc = ecc_weierstrass_curve(p, a, b, nonsquare);

    curve->w.G = ecc_weierstrass_point_new(curve->w.wc, G_x, G_y);
    curve->w.G_order = mp_copy(G_order);
}